

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O3

void __thiscall
groundupdb::HashedValue::
HashedValue<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
          (HashedValue *this,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *from)

{
  size_t sVar1;
  __node_base _Var2;
  Bytes data;
  Bytes t;
  DefaultHash h1;
  decay_t<std::unordered_set<std::__cxx11::basic_string<char>_>_> v;
  void *local_f8;
  undefined8 uStack_f0;
  long local_e8;
  Bytes local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  HashedValue local_a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  this->_vptr_HashedValue = (_func_int **)&PTR__HashedValue_001d3818;
  this->m_has_value = true;
  (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_length = 0;
  this->m_hash = 0;
  local_a0._vptr_HashedValue = (_func_int **)&local_68;
  local_68._M_buckets = (__buckets_ptr)0x0;
  local_68._M_bucket_count = (from->_M_h)._M_bucket_count;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = (from->_M_h)._M_element_count;
  local_68._M_rehash_policy._M_max_load_factor = (from->_M_h)._M_rehash_policy._M_max_load_factor;
  local_68._M_rehash_policy._4_4_ = *(undefined4 *)&(from->_M_h)._M_rehash_policy.field_0x4;
  local_68._M_rehash_policy._M_next_resize = (from->_M_h)._M_rehash_policy._M_next_resize;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_a0._vptr_HashedValue,&from->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)&local_a0);
  local_f8 = (void *)0x0;
  uStack_f0 = 0;
  local_e8 = 0;
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var2._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,_Var2._M_nxt[1]._M_nxt,
                 (long)&(_Var2._M_nxt[1]._M_nxt)->_M_nxt + (long)&(_Var2._M_nxt[2]._M_nxt)->_M_nxt);
      HashedValue<std::__cxx11::string>(&local_a0,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      HashedValue::data(&local_d8,&local_a0);
      std::vector<std::byte,std::allocator<std::byte>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>>
                ((vector<std::byte,std::allocator<std::byte>> *)&local_f8,uStack_f0,
                 local_d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (local_d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_a0._vptr_HashedValue = (_func_int **)&PTR__HashedValue_001d3818;
      if (local_a0.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.m_data.
                              super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.m_data.
                              super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt;
    } while (_Var2._M_nxt != (_Hash_node_base *)0x0);
  }
  std::vector<std::byte,std::allocator<std::byte>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>>
            ((vector<std::byte,std::allocator<std::byte>> *)&this->m_data,
             (this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,local_f8,uStack_f0);
  this->m_length =
       (long)(this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->m_data).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_f8 != (void *)0x0) {
    operator_delete(local_f8,local_e8 - (long)local_f8);
  }
  DefaultHash::DefaultHash((DefaultHash *)&local_a0,1,2,3,4);
  sVar1 = DefaultHash::operator()((DefaultHash *)&local_a0,&this->m_data);
  this->m_hash = sVar1;
  DefaultHash::~DefaultHash((DefaultHash *)&local_a0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

HashedValue(VT from) : m_has_value(true), m_data(), m_length(0), m_hash(0)
  {
    // first remove reference
    auto v = std::decay_t<VT>(from);
    // second check if its a basic type and convert to bytes
    if constexpr(std::is_same_v<std::string, decltype(v)>) {
      //std::cout << "DECLTYPE std::string" << std::endl;
      m_length = from.length();
      m_data.reserve(m_length);
      std::transform(from.begin(), from.end(), std::back_inserter(m_data),
                     [](auto c) { return static_cast<std::byte>(c); });
                     
    } else if constexpr (std::is_same_v<char *, decltype(v)>) {
      //std::cout << "DECLTYPE char ptr" << std::endl;
      std::string s(v);
      m_length = s.length();
      m_data.reserve(m_length);
      std::transform(s.begin(), s.end(), std::back_inserter(m_data),
                     [](auto c) { return static_cast<std::byte>(c); });

    } else if constexpr (std::is_same_v<const char*, decltype(v)>) {
      //std::cout << "DECLTYPE char array" << std::endl;
      std::string s(v);
      m_length = s.length();
      m_data.reserve(m_length);
      std::transform(s.begin(), s.end(), std::back_inserter(m_data),
                     [](auto c) { return static_cast<std::byte>(c); });

    } else if constexpr(std::numeric_limits<VT>::is_integer) {
      //std::cout << "DECLTYPE numeric" << std::endl;
      m_length = sizeof(v) / sizeof(std::byte);
      auto vcopy = v; // copy ready for modification
      m_data.reserve(m_length);
      for (auto i = std::size_t(0); i < m_length; i++)
      {
        // NOTE This implements little-endian conversion TODO do we want this?
        m_data.push_back(static_cast<std::byte>((vcopy & 0xFF)));
        vcopy = vcopy >> sizeof(std::byte);
      }

    } else if constexpr(std::is_floating_point_v<VT>) {
      //std::cout << "DECLTYPE float" << std::endl;
      m_length = sizeof(v) / sizeof(std::byte);
      auto vcopy = v; // copy ready for modification
      unsigned int asInt = *((int *)&vcopy);
      m_data.reserve(m_length);
      for (auto i = std::size_t(0); i < m_length; i++)
      {
        // NOTE This implements little-endian conversion TODO do we want this?
        m_data.push_back(static_cast<std::byte>((asInt & 0xFF)));
        asInt = asInt >> sizeof(std::byte);
      }

    } else if constexpr (std::is_same_v<Bytes, decltype(v)>) {
      m_length = from.size();
      m_data = std::move(from);

    } else if constexpr (is_container<decltype(v)>::value) {
      // Convert contents to EncodedValue and serialise it
      // TODO in future this will preserve its runtime type
      Bytes data; 
      // ^^^ can't reserve yet - may be dynamic type in container 
      //     (We MUST do a deep copy)
      for (auto iter = v.begin();iter != v.end();++iter) {
        HashedValue hv(*iter); 
        // ^^^ uses template functions, so a little recursion here
        Bytes t = hv.data();
        data.insert(std::end(data),t.begin(),t.end());
        // https://stackoverflow.com/questions/2551775/appending-a-vector-to-a-vector
      }
      // TODO append EncodedValue(CPP,decltype<VT>,...,data) instead
      m_data.insert(std::end(m_data),data.begin(),data.end());
      m_length = m_data.size(); // can only know after inserts
    // } else if constexpr (is_keyed_container<decltype(v)>::value) {
    //   std::cout << "DECLTYPE keyed container" << std::endl;

    
    } else if constexpr (is_keyed_container<decltype(v)>::value) {
      // Convert contents to EncodedValue and serialise it
      // TODO in future this will preserve its runtime type
      Bytes data; 
      // ^^^ can't reserve yet - may be dynamic type in container 
      //     (We MUST do a deep copy)
      for (auto iter = v.begin();iter != v.end();++iter) {
        HashedValue hv(iter->second); 
        // ^^^ uses template functions, so a little recursion here
        Bytes t = hv.data();
        data.insert(std::end(data),t.begin(),t.end());
        // https://stackoverflow.com/questions/2551775/appending-a-vector-to-a-vector
      }
      // TODO append EncodedValue(CPP,decltype<VT>,...,data) instead
      m_data.insert(std::end(m_data),data.begin(),data.end());
      m_length = m_data.size(); // can only know after inserts
      

/*
    } else if constexpr(std::is_convertible_v<decltype(v),HashedValue> && !std::is_same_v<decltype(v),HashedValue>) {
      HashedValue hv = v; // calls type cast operator - https://www.cplusplus.com/doc/tutorial/typecasting/
      m_has_value = hv.m_has_value;
      m_length = hv.m_length;
      m_data = std::move(hv.m_data);
      m_hash = hv.m_hash;
      return; // no need to recompute hash

      */
    } else {
      throw std::runtime_error(typeid(v).name());
      // TODO we don't support it, fire off a compiler warning
      //static_assert(false, "Must be a supported type, or convertible to std::vector<std::byte>!");
    }
    // TODO use correct hasher for current database connection, with correct initialisation settings
    DefaultHash h1{1, 2, 3, 4};
    m_hash = h1(m_data);
  }